

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  bool bVar1;
  int iVar2;
  CppType CVar3;
  UnknownFieldSet *pUVar4;
  reference ppFVar5;
  MapValueRef *this_00;
  Message *pMVar6;
  MapFieldBase *local_120;
  int local_100;
  int j;
  int size;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  undefined1 local_30 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  Message *message_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)GetReflectionOrDie(message);
  pUVar4 = Reflection::GetUnknownFields
                     ((Reflection *)
                      fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,message);
  iVar2 = UnknownFieldSet::field_count(pUVar4);
  if (iVar2 != 0) {
    pUVar4 = Reflection::MutableUnknownFields
                       ((Reflection *)
                        fields.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,message);
    UnknownFieldSet::Clear(pUVar4);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_30);
  Reflection::ListFields
            ((Reflection *)
             fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_30);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_30);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                     *)&field), bVar1) {
    ppFVar5 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    this = *ppFVar5;
    CVar3 = FieldDescriptor::cpp_type(this);
    if (CVar3 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(this);
      if (bVar1) {
        local_120 = Reflection::MutableMapData
                              ((Reflection *)
                               fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this);
      }
      else {
        local_120 = (MapFieldBase *)0x0;
      }
      if ((local_120 == (MapFieldBase *)0x0) ||
         (bVar1 = MapFieldBase::IsMapValid(local_120), !bVar1)) {
        bVar1 = FieldDescriptor::is_repeated(this);
        if (bVar1) {
          iVar2 = Reflection::FieldSize
                            ((Reflection *)
                             fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this);
          for (local_100 = 0; local_100 < iVar2; local_100 = local_100 + 1) {
            pMVar6 = Reflection::MutableRepeatedMessage
                               ((Reflection *)
                                fields.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this,
                                local_100);
            Message::DiscardUnknownFields(pMVar6);
          }
        }
        else {
          pMVar6 = Reflection::MutableMessage
                             ((Reflection *)
                              fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this,
                              (MessageFactory *)0x0);
          Message::DiscardUnknownFields(pMVar6);
        }
      }
      else {
        bVar1 = IsMapValueMessageTyped(this);
        if (bVar1) {
          MapIterator::MapIterator
                    ((MapIterator *)&end.value_.super_MapValueConstRef.type_,message,this);
          MapIterator::MapIterator((MapIterator *)&j,message,this);
          MapFieldBase::MapBegin(local_120,(MapIterator *)&end.value_.super_MapValueConstRef.type_);
          MapFieldBase::MapEnd(local_120,(MapIterator *)&j);
          while (bVar1 = protobuf::operator!=
                                   ((MapIterator *)&end.value_.super_MapValueConstRef.type_,
                                    (MapIterator *)&j), bVar1) {
            this_00 = MapIterator::MutableValueRef
                                ((MapIterator *)&end.value_.super_MapValueConstRef.type_);
            pMVar6 = MapValueRef::MutableMessageValue(this_00);
            Message::DiscardUnknownFields(pMVar6);
            MapIterator::operator++((MapIterator *)&end.value_.super_MapValueConstRef.type_);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_30);
  return;
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  if (reflection->GetUnknownFields(*message).field_count() != 0) {
    reflection->MutableUnknownFields(message)->Clear();
  }

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    const MapFieldBase* map_field =
        field->is_map() ? reflection->MutableMapData(message, field) : nullptr;
    if (map_field != nullptr && map_field->IsMapValid()) {
      if (IsMapValueMessageTyped(field)) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}